

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_conn.cc
# Opt level: O1

void __thiscall iqxmlrpc::Server_connection::Server_connection(Server_connection *this,Inet_addr *a)

{
  sp_counted_base *psVar1;
  pointer __s;
  
  this->_vptr_Server_connection = (_func_int **)&PTR___cxa_pure_virtual_0018b6b0;
  (this->peer_addr)._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_00188ef8;
  (this->peer_addr).impl_.px = (a->impl_).px;
  psVar1 = (a->impl_).pn.pi_;
  (this->peer_addr).impl_.pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->use_count_ = psVar1->use_count_ + 1;
    UNLOCK();
  }
  this->server = (Server *)0x0;
  (this->preader).header_cache._M_dataplus._M_p = (pointer)&(this->preader).header_cache.field_2;
  (this->preader).header_cache._M_string_length = 0;
  (this->preader).header_cache.field_2._M_local_buf[0] = '\0';
  (this->preader).content_cache._M_dataplus._M_p = (pointer)&(this->preader).content_cache.field_2;
  (this->preader).content_cache._M_string_length = 0;
  (this->preader).content_cache.field_2._M_local_buf[0] = '\0';
  (this->preader).header = (Header *)0x0;
  (this->preader).ver_level_ = HTTP_CHECK_WEAK;
  (this->preader).constructed = false;
  (this->preader).pkt_max_sz = 0;
  (this->preader).total_sz = 0;
  (this->preader).continue_sent_ = false;
  (this->response)._M_dataplus._M_p = (pointer)&(this->response).field_2;
  (this->response)._M_string_length = 0;
  (this->response).field_2._M_local_buf[0] = '\0';
  this->keep_alive = false;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x10000);
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = __s;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s;
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x10000;
  memset(__s,0,0x10000);
  (this->read_buf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s + 0x10000;
  return;
}

Assistant:

Server_connection::Server_connection( const iqnet::Inet_addr& a ):
  peer_addr(a),
  server(0),
  keep_alive(false),
  read_buf_(65536, '\0')
{
}